

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

TcParseTableBase * __thiscall google::protobuf::Reflection::CreateTcParseTable(Reflection *this)

{
  ReflectionSchema *pRVar1;
  pointer pFVar2;
  pointer pSVar3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  undefined2 uVar7;
  bool bVar8;
  undefined3 uVar9;
  float fVar10;
  pointer pFVar11;
  pointer pFVar12;
  bool bVar13;
  bool bVar14;
  uint32_t uVar15;
  Descriptor *pDVar16;
  ulong uVar17;
  TcParseTableBase *pTVar18;
  undefined4 extraout_var;
  TailCallParseFunc p_Var19;
  SkipEntry16 *pSVar20;
  Nonnull<const_char_*> pcVar21;
  SkipEntryBlock *block;
  pointer pFVar22;
  pointer pSVar23;
  int iVar24;
  pointer pFVar25;
  long lVar26;
  pointer puVar27;
  uint uVar28;
  const_iterator __begin3;
  pointer pSVar29;
  const_iterator __end3;
  uint uVar30;
  long lVar31;
  FieldDescriptor *pFVar32;
  int iVar33;
  __normal_iterator<google::protobuf::internal::TailCallTableInfo::FieldOptions_*,_std::vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>_>
  __i;
  pointer pFVar34;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields;
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  fields;
  TailCallTableInfo table_info;
  uint16_t local_124;
  uint16_t local_120;
  uint32_t local_11c;
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  local_118;
  uint32_t local_fc;
  undefined1 local_f8 [24];
  uint32_t uStack_e0;
  uint uStack_dc;
  pointer local_d8;
  pointer local_c8;
  int local_c0;
  undefined4 uStack_bc;
  int local_b8;
  undefined4 uStack_b4;
  pointer local_b0;
  uint32_t local_a8;
  vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  local_a0;
  pointer local_88;
  pointer local_80;
  pointer local_78;
  byte local_70;
  LogMessageFatal local_60;
  pointer local_50;
  ClassData *local_48;
  ulong local_40;
  ulong local_38;
  
  local_118.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (FieldOptions *)0x0;
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ::reserve(&local_118,(long)this->descriptor_->field_count_);
  pDVar16 = this->descriptor_;
  if (0 < pDVar16->field_count_) {
    pRVar1 = &this->schema_;
    lVar31 = 0;
    lVar26 = 0;
    do {
      pFVar32 = (FieldDescriptor *)(&pDVar16->fields_->super_SymbolBase + lVar31);
      bVar13 = internal::ReflectionSchema::IsFieldInlined(pRVar1,pFVar32);
      local_f8._0_8_ = pFVar32;
      local_f8._8_4_ = internal::ReflectionSchema::HasBitIndex(pRVar1,pFVar32);
      local_f8._12_4_ = 0x3f800000;
      local_f8._16_5_ = (uint5)bVar13 << 0x10;
      bVar14 = internal::ReflectionSchema::IsSplit(pRVar1,pFVar32);
      local_f8[0x15] = bVar14;
      uVar15 = 0xffffffff;
      if (bVar13) {
        uVar15 = internal::ReflectionSchema::InlinedStringIndex(pRVar1,pFVar32);
      }
      uVar28 = uStack_dc;
      uStack_dc = uStack_dc & 0xffffff00;
      uStack_e0 = uVar15;
      if (local_118.
          super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_118.
          super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
        ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::FieldOptions>
                  (&local_118,
                   (iterator)
                   local_118.
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(FieldOptions *)local_f8);
      }
      else {
        uVar17 = CONCAT44(uVar28,uVar15) & 0xffffff00ffffffff;
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->lazy_opt = local_f8._16_2_;
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->is_string_inlined = (bool)local_f8[0x12];
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->is_implicitly_weak = (bool)local_f8[0x13];
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->use_direct_tcparser_table =
             (bool)local_f8[0x14];
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->should_split = (bool)local_f8[0x15];
        *(undefined2 *)
         &(local_118.
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
           ._M_impl.super__Vector_impl_data._M_finish)->field_0x16 = local_f8._22_2_;
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->inlined_string_index = (int)uVar17;
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->use_micro_string =
             (bool)(char)(uVar17 >> 0x20);
        *(int3 *)&(local_118.
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->field_0x1d = (int3)(uVar17 >> 0x28);
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->field = (FieldDescriptor *)local_f8._0_8_;
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->has_bit_index = local_f8._8_4_;
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->presence_probability = (float)local_f8._12_4_;
        local_118.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_118.
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      lVar26 = lVar26 + 1;
      pDVar16 = this->descriptor_;
      lVar31 = lVar31 + 0x58;
    } while (lVar26 < pDVar16->field_count_);
  }
  pFVar12 = local_118.
            super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pFVar11 = local_118.
            super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_118.
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_118.
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar31 = (long)local_118.
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_118.
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar17 = lVar31 >> 5;
    lVar26 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar26 == 0; lVar26 = lVar26 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::internal::TailCallTableInfo::FieldOptions*,std::vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::Reflection::CreateTcParseTable()const::__0>>
              (local_118.
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_118.
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar26 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar31 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::internal::TailCallTableInfo::FieldOptions*,std::vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::Reflection::CreateTcParseTable()const::__0>>
                (pFVar11,pFVar12);
    }
    else {
      pFVar34 = pFVar11 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::internal::TailCallTableInfo::FieldOptions*,std::vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::Reflection::CreateTcParseTable()const::__0>>
                (pFVar11,pFVar34);
      for (; pFVar34 != pFVar12; pFVar34 = pFVar34 + 1) {
        pFVar32 = pFVar34->field;
        local_f8._16_8_ = *(undefined8 *)&pFVar34->inlined_string_index;
        local_f8._0_8_ = *(undefined8 *)&pFVar34->has_bit_index;
        local_f8._8_8_ = *(undefined8 *)&pFVar34->lazy_opt;
        pFVar22 = pFVar34;
        pFVar25 = pFVar34;
        if (pFVar32->number_ < (pFVar34[-1].field)->number_) {
          do {
            pFVar22 = pFVar25 + -1;
            bVar13 = pFVar25[-1].is_string_inlined;
            bVar14 = pFVar25[-1].is_implicitly_weak;
            bVar5 = pFVar25[-1].use_direct_tcparser_table;
            bVar6 = pFVar25[-1].should_split;
            uVar7 = *(undefined2 *)&pFVar25[-1].field_0x16;
            iVar24 = pFVar25[-1].inlined_string_index;
            bVar8 = pFVar25[-1].use_micro_string;
            uVar9 = *(undefined3 *)&pFVar25[-1].field_0x1d;
            pFVar25->lazy_opt = pFVar25[-1].lazy_opt;
            pFVar25->is_string_inlined = bVar13;
            pFVar25->is_implicitly_weak = bVar14;
            pFVar25->use_direct_tcparser_table = bVar5;
            pFVar25->should_split = bVar6;
            *(undefined2 *)&pFVar25->field_0x16 = uVar7;
            pFVar25->inlined_string_index = iVar24;
            pFVar25->use_micro_string = bVar8;
            *(undefined3 *)&pFVar25->field_0x1d = uVar9;
            iVar24 = pFVar25[-1].has_bit_index;
            fVar10 = pFVar25[-1].presence_probability;
            pFVar25->field = pFVar25[-1].field;
            pFVar25->has_bit_index = iVar24;
            pFVar25->presence_probability = fVar10;
            pFVar2 = pFVar25 + -2;
            pFVar25 = pFVar22;
          } while (pFVar32->number_ < pFVar2->field->number_);
        }
        pFVar22->field = pFVar32;
        *(undefined8 *)&pFVar22->has_bit_index = local_f8._0_8_;
        *(undefined8 *)&pFVar22->lazy_opt = local_f8._8_8_;
        *(undefined8 *)&pFVar22->inlined_string_index = local_f8._16_8_;
      }
    }
  }
  local_60.super_LogMessage.errno_saver_.saved_errno_._0_1_ = false;
  local_60.super_LogMessage.errno_saver_.saved_errno_._1_1_ = false;
  ordered_fields.len_ =
       (long)local_118.
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_118.
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  ordered_fields.ptr_ =
       local_118.
       super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
       ._M_impl.super__Vector_impl_data._M_start;
  internal::TailCallTableInfo::TailCallTableInfo
            ((TailCallTableInfo *)local_f8,this->descriptor_,(MessageOptions *)&local_60,
             ordered_fields);
  lVar26 = (long)(local_f8._16_8_ - local_f8._8_8_) >> 5;
  iVar24 = 1 << (local_70 & 0x1f);
  iVar33 = (int)lVar26;
  if (iVar24 == iVar33) {
    pcVar21 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                        ((long)(int)((ulong)(local_f8._16_8_ - local_f8._8_8_) >> 5),(long)iVar24,
                         "static_cast<int>(fast_entries_count) == 1 << table_info.table_size_log2");
  }
  if (pcVar21 == (Nonnull<const_char_*>)0x0) {
    uVar28 = iVar33 * 0x10 + 0x39U & 0xfff8;
    if (local_a0.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_a0.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar24 = 4;
    }
    else {
      iVar24 = 2;
      pSVar23 = local_a0.
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        iVar24 = iVar24 + ((uint)((ulong)((long)(pSVar23->entries).
                                                super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(pSVar23->entries).
                                               super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 1) &
                          0xfffffffe) + 3;
        pSVar23 = pSVar23 + 1;
      } while (pSVar23 !=
               local_a0.
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
               ._M_impl.super__Vector_impl_data._M_finish);
      iVar24 = iVar24 * 2;
    }
    uVar30 = iVar24 + uVar28 + 2 & 0xfffffffc;
    uVar17 = (ulong)(uVar30 + (int)((ulong)((long)local_118.
                                                  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_118.
                                                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 5) *
                              0xc + 7 & 0xfffffff8);
    puVar27 = local_80 +
              uVar17 + ((CONCAT44(uStack_b4,local_b8) - CONCAT44(uStack_bc,local_c0) >> 1) -
                       (long)local_88);
    pTVar18 = (TcParseTableBase *)operator_new((long)(int)puVar27);
    pRVar1 = &this->schema_;
    local_50 = puVar27;
    local_40 = uVar17;
    local_38 = (ulong)uVar30;
    if ((this->schema_).has_bits_offset_ == -1) {
      local_120 = 0;
    }
    else {
      uVar15 = internal::ReflectionSchema::HasBitsOffset(pRVar1);
      local_120 = (uint16_t)uVar15;
    }
    local_11c = 0;
    if ((this->schema_).extensions_offset_ == -1) {
      local_124 = 0;
    }
    else {
      uVar15 = internal::ReflectionSchema::GetExtensionSetOffset(pRVar1);
      local_124 = (uint16_t)uVar15;
    }
    pFVar12 = local_118.
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pFVar11 = local_118.
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_118.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_118.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_11c = (local_118.
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].field)->number_;
    }
    local_fc = local_a8;
    uVar30 = local_b8 - local_c0;
    iVar24 = (*(pRVar1->default_instance_->super_MessageLite)._vptr_MessageLite[4])();
    local_48 = (ClassData *)CONCAT44(extraout_var,iVar24);
    p_Var19 = GetFastParseFunction(local_f8[0]);
    pTVar18->has_bits_offset = local_120;
    pTVar18->extension_offset = local_124;
    pTVar18->max_field_number = local_11c;
    pTVar18->fast_idx_mask = (char)lVar26 * '\b' + 0xf8;
    pTVar18->field_0x9 = pTVar18->field_0x9 & 0xfe;
    pTVar18->lookup_table_offset = (uint16_t)uVar28;
    pTVar18->skipmap32 = local_fc;
    pTVar18->field_entries_offset = (uint32_t)local_38;
    pTVar18->num_field_entries = (uint16_t)((uint)((int)pFVar12 - (int)pFVar11) >> 5);
    pTVar18->num_aux_entries = (uint16_t)(uVar30 >> 4);
    pTVar18->aux_offset = (uint32_t)local_40;
    pTVar18->class_data = local_48;
    pTVar18->post_loop_handler = (PostLoopHandler)0x0;
    pTVar18->fallback = p_Var19;
    PopulateTcParseFastEntries(this,(TailCallTableInfo *)local_f8,(FastFieldEntry *)(pTVar18 + 1));
    pSVar20 = (SkipEntry16 *)((long)&pTVar18->has_bits_offset + (ulong)pTVar18->lookup_table_offset)
    ;
    for (; local_a0.
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_a0.
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        local_a0.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_a0.
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      uVar7 = *(undefined2 *)
               ((long)&(local_a0.
                        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first_fnum + 2);
      pSVar20->skipmap =
           *(undefined2 *)
            &(local_a0.
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
              ._M_impl.super__Vector_impl_data._M_start)->first_fnum;
      pSVar20->field_entry_offset = uVar7;
      pSVar29 = ((local_a0.
                  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                  ._M_impl.super__Vector_impl_data._M_start)->entries).
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar3 = ((local_a0.
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                 ._M_impl.super__Vector_impl_data._M_start)->entries).
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pSVar20[1].skipmap = (uint16_t)((uint)((int)pSVar3 - (int)pSVar29) >> 2);
      pSVar20 = (SkipEntry16 *)&pSVar20[1].field_entry_offset;
      for (; pSVar3 != pSVar29; pSVar29 = pSVar29 + 1) {
        *pSVar20 = *pSVar29;
        pSVar20 = pSVar20 + 1;
      }
    }
    pSVar20->skipmap = 0xffff;
    pSVar20->field_entry_offset = 0xffff;
    PopulateTcParseEntries
              (this,(TailCallTableInfo *)local_f8,
               (FieldEntry *)
               ((long)&pTVar18->has_bits_offset + (ulong)pTVar18->field_entries_offset));
    PopulateTcParseFieldAux
              (this,(TailCallTableInfo *)local_f8,
               (FieldAux *)((long)&pTVar18->has_bits_offset + (ulong)pTVar18->aux_offset));
    if (local_88 != local_80) {
      memcpy((void *)((long)&pTVar18->has_bits_offset +
                     (ulong)pTVar18->num_aux_entries * 8 + (ulong)pTVar18->aux_offset),local_88,
             (long)local_80 - (long)local_88);
    }
    if (local_80 +
        (((ulong)pTVar18->aux_offset + (ulong)pTVar18->num_aux_entries * 8) - (long)local_88) ==
        (pointer)(long)(int)local_50) {
      pcVar21 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          ((long)(local_80 +
                                 (((ulong)pTVar18->aux_offset + (ulong)pTVar18->num_aux_entries * 8)
                                 - (long)local_88)),(long)(int)local_50,
                           "res->name_data() + table_info.field_name_data.size() - reinterpret_cast<char*>(res) == byte_size"
                          );
    }
    if (pcVar21 == (Nonnull<const_char_*>)0x0) {
      if (local_88 != (pointer)0x0) {
        operator_delete(local_88,(long)local_78 - (long)local_88);
      }
      std::
      vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
      ::~vector(&local_a0);
      pvVar4 = (void *)CONCAT44(uStack_bc,local_c0);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,(long)local_b0 - (long)pvVar4);
      }
      if (local_d8 != (pointer)0x0) {
        operator_delete(local_d8,(long)local_c8 - (long)local_d8);
      }
      if ((pointer)local_f8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_f8._8_8_,CONCAT44(uStack_dc,uStack_e0) - local_f8._8_8_);
      }
      if (local_118.
          super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.
                        super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_118.
                              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.
                              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return pTVar18;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xe82,pcVar21);
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xe44,pcVar21);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_60);
}

Assistant:

const internal::TcParseTableBase* Reflection::CreateTcParseTable() const {
  using TcParseTableBase = internal::TcParseTableBase;

  constexpr int kNoHasbit = -1;
  std::vector<internal::TailCallTableInfo::FieldOptions> fields;
  fields.reserve(descriptor_->field_count());
  for (int i = 0; i < descriptor_->field_count(); ++i) {
    auto* field = descriptor_->field(i);
    const bool is_inlined = IsInlined(field);
    fields.push_back({
        field,  //
        static_cast<int>(schema_.HasBitIndex(field)),
        1.f,  // All fields are assumed present.
        GetLazyStyle(field),
        is_inlined,
        // Only LITE can be implicitly weak.
        /* is_implicitly_weak */ false,
        // We could change this to use direct table.
        // Might be easier to do when all messages support TDP.
        /* use_direct_tcparser_table */ false,
        schema_.IsSplit(field),
        is_inlined ? static_cast<int>(schema_.InlinedStringIndex(field))
                   : kNoHasbit,
        field->cpp_type() == FieldDescriptor::CPPTYPE_STRING &&
            IsMicroString(field),
    });
  }
  std::sort(fields.begin(), fields.end(), [](const auto& a, const auto& b) {
    return a.field->number() < b.field->number();
  });

  internal::TailCallTableInfo table_info(
      descriptor_,
      {
          /* is_lite */ false,
          /* uses_codegen */ false,
      },
      fields);

  const size_t fast_entries_count = table_info.fast_path_fields.size();
  ABSL_CHECK_EQ(static_cast<int>(fast_entries_count),
                1 << table_info.table_size_log2);
  const uint16_t lookup_table_offset = AlignTo<uint16_t>(
      sizeof(TcParseTableBase) +
      fast_entries_count * sizeof(TcParseTableBase::FastFieldEntry));
  const uint32_t field_entry_offset = AlignTo<TcParseTableBase::FieldEntry>(
      lookup_table_offset +
      sizeof(uint16_t) * table_info.num_to_entry_table.size16());
  const uint32_t aux_offset = AlignTo<TcParseTableBase::FieldAux>(
      field_entry_offset +
      sizeof(TcParseTableBase::FieldEntry) * fields.size());

  int byte_size =
      aux_offset +
      sizeof(TcParseTableBase::FieldAux) * table_info.aux_entries.size() +
      sizeof(char) * table_info.field_name_data.size();

  void* p = ::operator new(byte_size);
  auto* res = ::new (p) TcParseTableBase{
      static_cast<uint16_t>(schema_.HasHasbits() ? schema_.HasBitsOffset() : 0),
      schema_.HasExtensionSet()
          ? static_cast<uint16_t>(schema_.GetExtensionSetOffset())
          : uint16_t{0},
      static_cast<uint32_t>(fields.empty() ? 0 : fields.back().field->number()),
      static_cast<uint8_t>((fast_entries_count - 1) << 3),
      lookup_table_offset,
      table_info.num_to_entry_table.skipmap32,
      field_entry_offset,
      static_cast<uint16_t>(fields.size()),
      static_cast<uint16_t>(table_info.aux_entries.size()),
      aux_offset,
      schema_.default_instance_->GetClassData(),
      nullptr,
      GetFastParseFunction(table_info.fallback_function)
#ifdef PROTOBUF_PREFETCH_PARSE_TABLE
          ,
      nullptr
#endif  // PROTOBUF_PREFETCH_PARSE_TABLE
  };
#ifdef PROTOBUF_PREFETCH_PARSE_TABLE
  // We'll prefetch `to_prefetch->to_prefetch` unconditionally to avoid
  // branches. Here we don't know which field is the hottest, so set the pointer
  // to itself to avoid nullptr.
  res->to_prefetch = res;
#endif  // PROTOBUF_PREFETCH_PARSE_TABLE

  // Now copy the rest of the payloads
  PopulateTcParseFastEntries(table_info, res->fast_entry(0));

  PopulateTcParseLookupTable(table_info, res->field_lookup_begin());

  PopulateTcParseEntries(table_info, res->field_entries_begin());

  PopulateTcParseFieldAux(table_info, res->field_aux(0u));

  // Copy the name data.
  if (!table_info.field_name_data.empty()) {
    memcpy(res->name_data(), table_info.field_name_data.data(),
           table_info.field_name_data.size());
  }
  // Validation to make sure we used all the bytes correctly.
  ABSL_CHECK_EQ(res->name_data() + table_info.field_name_data.size() -
                    reinterpret_cast<char*>(res),
                byte_size);

  return res;
}